

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

char * __thiscall
cmOutputConverter::GetRelativeRootPath(cmOutputConverter *this,RelativeRoot relroot)

{
  cmState *pcVar1;
  char *pcVar2;
  Directory local_30;
  
  switch(relroot) {
  case HOME:
    pcVar1 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pcVar2 = cmState::GetSourceDirectory(pcVar1);
    return pcVar2;
  case START:
    cmState::Snapshot::GetDirectory(&local_30,&this->StateSnapshot);
    pcVar2 = cmState::Directory::GetCurrentSource(&local_30);
    break;
  case HOME_OUTPUT:
    pcVar1 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pcVar2 = cmState::GetBinaryDirectory(pcVar1);
    return pcVar2;
  case START_OUTPUT:
    cmState::Snapshot::GetDirectory(&local_30,&this->StateSnapshot);
    pcVar2 = cmState::Directory::GetCurrentBinary(&local_30);
    break;
  default:
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* cmOutputConverter::GetRelativeRootPath(RelativeRoot relroot) const
{
  switch (relroot)
    {
  case HOME:
    return this->GetState()->GetSourceDirectory();
  case START:
    return this->StateSnapshot.GetDirectory().GetCurrentSource();
  case HOME_OUTPUT:
    return this->GetState()->GetBinaryDirectory();
  case START_OUTPUT:
    return this->StateSnapshot.GetDirectory().GetCurrentBinary();
  default: break;
    }
  return 0;
}